

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O1

bool __thiscall MXNetNode::is_weight(MXNetNode *this)

{
  pointer pMVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  size_type *psVar6;
  bool bVar7;
  bool bVar8;
  
  pMVar1 = (this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (int)((long)(this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 3) * -0x45d1745d;
  bVar7 = 0 < (int)uVar4;
  if (0 < (int)uVar4) {
    __s2 = (this->name)._M_dataplus._M_p;
    sVar2 = (this->name)._M_string_length;
    psVar6 = &(pMVar1->name)._M_string_length;
    uVar5 = 1;
    do {
      __n = *psVar6;
      if (__n == sVar2) {
        if (__n == 0) {
          return bVar7;
        }
        iVar3 = bcmp((((string *)(psVar6 + -1))->_M_dataplus)._M_p,__s2,__n);
        if (iVar3 == 0) {
          return bVar7;
        }
      }
      bVar7 = uVar5 < (uVar4 & 0x7fffffff);
      psVar6 = psVar6 + 0xb;
      bVar8 = uVar5 != (uVar4 & 0x7fffffff);
      uVar5 = uVar5 + 1;
    } while (bVar8);
  }
  return bVar7;
}

Assistant:

bool MXNetNode::is_weight() const
{
    for (int i=0; i<(int)(*params).size(); i++)
    {
        const MXNetParam& p = (*params)[i];
        if (p.name == name)
            return true;
    }

    return false;
}